

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLin>
               *this,GetterXsYs<short> *getter1,GetterXsYs<short> *getter2,
              TransformerLogLin *transformer,ImU32 col)

{
  double dVar1;
  short sVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYs<short> *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  long lVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar11 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar11 = iVar3;
  }
  this->Prims = iVar11 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar10 = GImPlot;
  (this->P12).y = 0.0;
  lVar12 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  sVar2 = *(short *)((long)getter1->Ys + lVar12);
  dVar9 = log10((double)(int)*(short *)((long)getter1->Xs + lVar12) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar10->CurrentPlot;
  dVar1 = (pIVar4->XAxis).Range.Min;
  iVar3 = transformer->YAxis;
  IVar7.y = (float)(((double)(int)sVar2 - pIVar4->YAxis[iVar3].Range.Min) * pIVar10->My[iVar3] +
                   (double)pIVar10->PixelRange[iVar3].Min.y);
  IVar7.x = (float)((((double)(float)(dVar9 / pIVar10->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar10->Mx +
                   (double)pIVar10->PixelRange[iVar3].Min.x);
  this->P11 = IVar7;
  pIVar10 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  lVar12 = (long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  sVar2 = *(short *)((long)pGVar5->Ys + lVar12);
  dVar9 = log10((double)(int)*(short *)((long)pGVar5->Xs + lVar12) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar10->CurrentPlot;
  dVar1 = (pIVar4->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar8.y = (float)(((double)(int)sVar2 - pIVar4->YAxis[iVar3].Range.Min) * pIVar10->My[iVar3] +
                   (double)pIVar10->PixelRange[iVar3].Min.y);
  IVar8.x = (float)((((double)(float)(dVar9 / pIVar10->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar10->Mx +
                   (double)pIVar10->PixelRange[iVar3].Min.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }